

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::JunitReporter::EndTesting(JunitReporter *this,Totals *param_1)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  XmlWriter *pXVar2;
  XmlWriter *pXVar3;
  pointer pSVar4;
  long lVar5;
  pointer stats;
  ScopedElement scoped;
  ScopedElement e;
  XmlWriter xml;
  string local_e8;
  ScopedElement local_c8;
  JunitReporter *local_c0;
  undefined1 local_b8 [32];
  pointer local_98 [2];
  undefined1 local_88 [32];
  undefined8 uStack_68;
  undefined8 local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  undefined8 local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  ostream *local_38;
  
  local_38 = (this->m_config).m_stream;
  local_58 = &local_48;
  local_88._16_2_ = 0;
  local_88._24_8_ = 0;
  uStack_68 = 0;
  local_60 = 0;
  local_50 = 0;
  local_48._M_local_buf[0] = '\0';
  local_c0 = this;
  if ((this->m_statsForSuites).
      super__Vector_base<Catch::JunitReporter::Stats,_std::allocator<Catch::JunitReporter::Stats>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (this->m_statsForSuites).
      super__Vector_base<Catch::JunitReporter::Stats,_std::allocator<Catch::JunitReporter::Stats>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"testsuites","");
    XmlWriter::startElement((XmlWriter *)(local_88 + 0x10),&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
  }
  stats = (local_c0->m_statsForSuites).
          super__Vector_base<Catch::JunitReporter::Stats,_std::allocator<Catch::JunitReporter::Stats>_>
          ._M_impl.super__Vector_impl_data._M_start;
  pSVar4 = (local_c0->m_statsForSuites).
           super__Vector_base<Catch::JunitReporter::Stats,_std::allocator<Catch::JunitReporter::Stats>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (stats != pSVar4) {
    paVar1 = &local_e8.field_2;
    pXVar2 = (XmlWriter *)(local_88 + 0x10);
    do {
      local_e8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"testsuite","");
      local_b8._0_8_ = pXVar2;
      XmlWriter::startElement(pXVar2,&local_e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != paVar1) {
        operator_delete(local_e8._M_dataplus._M_p);
      }
      local_e8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"name","");
      XmlWriter::writeAttribute(pXVar2,&local_e8,&stats->m_name);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != paVar1) {
        operator_delete(local_e8._M_dataplus._M_p);
      }
      local_e8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"errors","");
      XmlWriter::writeAttribute<unsigned_long>(pXVar2,&local_e8,&stats->m_errorsCount);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != paVar1) {
        operator_delete(local_e8._M_dataplus._M_p);
      }
      local_e8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"failures","");
      XmlWriter::writeAttribute<unsigned_long>(pXVar2,&local_e8,&stats->m_failuresCount);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != paVar1) {
        operator_delete(local_e8._M_dataplus._M_p);
      }
      local_e8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"tests","");
      XmlWriter::writeAttribute<unsigned_long>(pXVar2,&local_e8,&stats->m_testsCount);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != paVar1) {
        operator_delete(local_e8._M_dataplus._M_p);
      }
      local_e8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"hostname","");
      XmlWriter::writeAttribute<char[4]>(pXVar2,&local_e8,(char (*) [4])"tbd");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != paVar1) {
        operator_delete(local_e8._M_dataplus._M_p);
      }
      local_e8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"time","");
      XmlWriter::writeAttribute<char[4]>(pXVar2,&local_e8,(char (*) [4])"tbd");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != paVar1) {
        operator_delete(local_e8._M_dataplus._M_p);
      }
      local_e8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"timestamp","");
      XmlWriter::writeAttribute<char[4]>(pXVar2,&local_e8,(char (*) [4])"tbd");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != paVar1) {
        operator_delete(local_e8._M_dataplus._M_p);
      }
      OutputTestCases(local_c0,pXVar2,stats);
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_b8);
      stats = stats + 1;
    } while (stats != pSVar4);
  }
  paVar1 = &local_e8.field_2;
  local_e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"system-out","");
  pXVar2 = (XmlWriter *)(local_88 + 0x10);
  local_c8.m_writer = pXVar2;
  XmlWriter::startElement(pXVar2,&local_e8);
  std::__cxx11::stringbuf::str();
  lVar5 = std::__cxx11::string::find_first_not_of((char *)local_98,0x1531c6,0);
  std::__cxx11::string::find_last_not_of((char *)local_98,0x1531c6,0xffffffffffffffff);
  if (lVar5 == -1) {
    local_b8._0_8_ = local_b8 + 0x10;
    local_b8._8_8_ = 0;
    local_b8[0x10] = '\0';
  }
  else {
    std::__cxx11::string::substr((ulong)local_b8,(ulong)local_98);
  }
  XmlWriter::writeText(local_c8.m_writer,(string *)local_b8,false);
  pXVar3 = (XmlWriter *)(local_b8 + 0x10);
  if ((XmlWriter *)local_b8._0_8_ != pXVar3) {
    operator_delete((void *)local_b8._0_8_);
  }
  if (local_98[0] != (pointer)local_88) {
    operator_delete(local_98[0]);
  }
  XmlWriter::ScopedElement::~ScopedElement(&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  local_e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"system-err","");
  local_c8.m_writer = pXVar2;
  XmlWriter::startElement(pXVar2,&local_e8);
  std::__cxx11::stringbuf::str();
  lVar5 = std::__cxx11::string::find_first_not_of((char *)local_98,0x1531c6,0);
  std::__cxx11::string::find_last_not_of((char *)local_98,0x1531c6,0xffffffffffffffff);
  if (lVar5 == -1) {
    local_b8._8_8_ = 0;
    local_b8[0x10] = '\0';
    local_b8._0_8_ = pXVar3;
  }
  else {
    std::__cxx11::string::substr((ulong)local_b8,(ulong)local_98);
  }
  XmlWriter::writeText(local_c8.m_writer,(string *)local_b8,false);
  if ((XmlWriter *)local_b8._0_8_ != pXVar3) {
    operator_delete((void *)local_b8._0_8_);
  }
  if (local_98[0] != (pointer)local_88) {
    operator_delete(local_98[0]);
  }
  XmlWriter::ScopedElement::~ScopedElement(&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  XmlWriter::~XmlWriter((XmlWriter *)(local_88 + 0x10));
  return;
}

Assistant:

Ptr<IConfig> fullConfig() const { return m_fullConfig; }